

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O1

int lua_getinfo(lua_State *L,char *what,lua_Debug *ar)

{
  char **name;
  uint uVar1;
  StkId pTVar2;
  CallInfo *pCVar3;
  long lVar4;
  Proto *p;
  Instruction *pIVar5;
  undefined4 uVar6;
  byte bVar7;
  char *pcVar8;
  Table *t;
  StkId pTVar9;
  uint uVar10;
  byte *pbVar11;
  int iVar12;
  lua_CFunction p_Var13;
  long lVar14;
  Table *x_;
  CallInfo *pCVar15;
  int local_5c;
  Value local_40;
  undefined4 local_38;
  
  if (L->status == '\x01') {
    pCVar15 = L->ci;
    pTVar9 = L->stack;
    pTVar2 = pCVar15->func;
    pCVar15->func = (StkId)((long)&pTVar9->value_ + pCVar15->extra);
    pCVar15->extra = (long)pTVar2 - (long)pTVar9;
  }
  if (*what == '>') {
    pTVar9 = L->top + -1;
    what = what + 1;
    L->top = pTVar9;
    pCVar15 = (CallInfo *)0x0;
  }
  else {
    pCVar15 = ar->i_ci;
    pTVar9 = pCVar15->func;
  }
  if ((pTVar9->tt_ & 0x1fU) == 6) {
    p_Var13 = (pTVar9->value_).f;
  }
  else {
    p_Var13 = (lua_CFunction)0x0;
  }
  name = &ar->name;
  local_5c = 1;
  pbVar11 = (byte *)what;
  do {
    bVar7 = *pbVar11;
    if (bVar7 < 0x66) {
      if (bVar7 != 0x4c) {
        if (bVar7 != 0x53) {
          if (bVar7 == 0) {
            pcVar8 = strchr(what,0x66);
            if (pcVar8 != (char *)0x0) {
              pTVar2 = L->top;
              iVar12 = pTVar9->tt_;
              uVar6 = *(undefined4 *)&pTVar9->field_0xc;
              pTVar2->value_ = pTVar9->value_;
              pTVar2->tt_ = iVar12;
              *(undefined4 *)&pTVar2->field_0xc = uVar6;
              L->top = L->top + 1;
            }
            if (L->status == '\x01') {
              pCVar15 = L->ci;
              pTVar9 = L->stack;
              pTVar2 = pCVar15->func;
              pCVar15->func = (StkId)((long)&pTVar9->value_ + pCVar15->extra);
              pCVar15->extra = (long)pTVar2 - (long)pTVar9;
            }
            pcVar8 = strchr(what,0x4c);
            if (pcVar8 != (char *)0x0) {
              if ((p_Var13 == (lua_CFunction)0x0) || (p_Var13[8] == (_func_int_lua_State_ptr)0x26))
              {
                pTVar9 = L->top;
                pTVar9->tt_ = 0;
                L->top = pTVar9 + 1;
              }
              else {
                lVar4 = *(long *)(*(long *)(p_Var13 + 0x18) + 0x48);
                t = luaH_new(L);
                pTVar9 = L->top;
                (pTVar9->value_).gc = (GCObject *)t;
                pTVar9->tt_ = 0x45;
                L->top = L->top + 1;
                local_40.b = 1;
                local_38 = 1;
                if (0 < *(int *)(*(long *)(p_Var13 + 0x18) + 0x1c)) {
                  lVar14 = 0;
                  do {
                    luaH_setint(L,t,(long)*(int *)(lVar4 + lVar14 * 4),(TValue *)&local_40);
                    lVar14 = lVar14 + 1;
                  } while (lVar14 < *(int *)(*(long *)(p_Var13 + 0x18) + 0x1c));
                }
              }
            }
            return local_5c;
          }
          goto switchD_00111fc7_caseD_6d;
        }
        if ((p_Var13 == (lua_CFunction)0x0) || (p_Var13[8] == (_func_int_lua_State_ptr)0x26)) {
          ar->source = "=[C]";
          ar->linedefined = -1;
          ar->lastlinedefined = -1;
          pcVar8 = "C";
        }
        else {
          lVar4 = *(long *)(p_Var13 + 0x18);
          pcVar8 = (char *)(*(long *)(lVar4 + 0x68) + 0x18);
          if (*(long *)(lVar4 + 0x68) == 0) {
            pcVar8 = "=?";
          }
          ar->source = pcVar8;
          iVar12 = *(int *)(lVar4 + 0x28);
          ar->linedefined = iVar12;
          ar->lastlinedefined = *(int *)(lVar4 + 0x2c);
          pcVar8 = "Lua";
          if (iVar12 == 0) {
            pcVar8 = "main";
          }
        }
        ar->what = pcVar8;
        luaO_chunkid(ar->short_src,ar->source,0x3c);
      }
      goto LAB_00112199;
    }
    switch(bVar7) {
    case 0x6c:
      iVar12 = -1;
      if ((pCVar15 != (CallInfo *)0x0) && ((pCVar15->callstatus & 2) != 0)) {
        lVar4 = *(long *)((pCVar15->func->value_).f + 0x18);
        lVar14 = *(long *)(lVar4 + 0x48);
        if (lVar14 != 0) {
          iVar12 = *(int *)(lVar14 + (((long)(pCVar15->u).l.savedpc - *(long *)(lVar4 + 0x38)) *
                                      0x40000000 + -0x100000000 >> 0x20) * 4);
        }
      }
      ar->currentline = iVar12;
      break;
    case 0x6d:
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x72:
    case 0x73:
switchD_00111fc7_caseD_6d:
      local_5c = 0;
      break;
    case 0x6e:
      if (pCVar15 == (CallInfo *)0x0) goto LAB_0011208f;
      if ((pCVar15->callstatus >> 8 & 1) != 0) {
        *name = "__gc";
        goto LAB_00112176;
      }
      if ((pCVar15->callstatus & 0x20) != 0) {
LAB_0011208f:
        pcVar8 = (char *)0x0;
        goto switchD_001121e5_caseD_9;
      }
      pCVar3 = pCVar15->previous;
      if ((pCVar3->callstatus & 2) == 0) goto LAB_0011208f;
      if ((pCVar3->callstatus & 4) != 0) {
        *name = "?";
        pcVar8 = "hook";
        goto switchD_001121e5_caseD_9;
      }
      p = *(Proto **)((pCVar3->func->value_).f + 0x18);
      pIVar5 = p->code;
      iVar12 = (int)((ulong)((long)(pCVar3->u).l.savedpc - (long)pIVar5) >> 2);
      uVar1 = pIVar5[(long)iVar12 + -1];
      uVar10 = uVar1 & 0x3f;
      pcVar8 = (char *)0x0;
      switch(uVar10) {
      case 6:
      case 7:
      case 0xc:
        break;
      case 8:
      case 10:
        pcVar8 = &DAT_00000001;
        break;
      default:
        goto switchD_001121e5_caseD_9;
      case 0xd:
      case 0xe:
      case 0xf:
      case 0x10:
      case 0x11:
      case 0x12:
      case 0x13:
      case 0x14:
      case 0x15:
      case 0x16:
      case 0x17:
      case 0x18:
        pcVar8 = (char *)(ulong)(uVar10 - 7);
        break;
      case 0x19:
        pcVar8 = (char *)0x12;
        break;
      case 0x1a:
        pcVar8 = (char *)0x13;
        break;
      case 0x1c:
        pcVar8 = (char *)0x4;
        break;
      case 0x1d:
        pcVar8 = (char *)0x16;
        break;
      case 0x1f:
        pcVar8 = (char *)0x5;
        break;
      case 0x20:
        pcVar8 = (char *)0x14;
        break;
      case 0x21:
        pcVar8 = (char *)0x15;
        break;
      case 0x24:
      case 0x25:
        pcVar8 = getobjname(p,iVar12 + -1,uVar1 >> 6 & 0xff,name);
        goto switchD_001121e5_caseD_9;
      case 0x29:
        *name = "for iterator";
        pcVar8 = "for iterator";
        goto switchD_001121e5_caseD_9;
      }
      *name = (char *)(L->l_G->tmname[(long)pcVar8] + 1);
LAB_00112176:
      pcVar8 = "metamethod";
switchD_001121e5_caseD_9:
      ar->namewhat = pcVar8;
      if (pcVar8 == (char *)0x0) {
        ar->namewhat = "";
        ar->name = (char *)0x0;
      }
      break;
    case 0x74:
      if (pCVar15 == (CallInfo *)0x0) {
        bVar7 = 0;
      }
      else {
        bVar7 = (byte)pCVar15->callstatus & 0x20;
      }
      ar->istailcall = bVar7;
      break;
    case 0x75:
      if (p_Var13 == (lua_CFunction)0x0) {
        ar->nups = '\0';
      }
      else {
        ar->nups = (uchar)p_Var13[10];
        if (p_Var13[8] != (_func_int_lua_State_ptr)0x26) {
          ar->isvararg = *(char *)(*(long *)(p_Var13 + 0x18) + 0xb);
          ar->nparams = *(uchar *)(*(long *)(p_Var13 + 0x18) + 10);
          break;
        }
      }
      ar->nparams = '\0';
      ar->isvararg = '\x01';
      break;
    default:
      if (bVar7 != 0x66) goto switchD_00111fc7_caseD_6d;
    }
LAB_00112199:
    pbVar11 = pbVar11 + 1;
  } while( true );
}

Assistant:

LUA_API int lua_getinfo (lua_State *L, const char *what, lua_Debug *ar) {
  int status;
  Closure *cl;
  CallInfo *ci;
  StkId func;
  lua_lock(L);
  swapextra(L);
  if (*what == '>') {
    ci = NULL;
    func = L->top - 1;
    api_check(L, ttisfunction(func), "function expected");
    what++;  /* skip the '>' */
    L->top--;  /* pop function */
  }
  else {
    ci = ar->i_ci;
    func = ci->func;
    lua_assert(ttisfunction(ci->func));
  }
  cl = ttisclosure(func) ? clvalue(func) : NULL;
  status = auxgetinfo(L, what, ar, cl, ci);
  if (strchr(what, 'f')) {
    setobjs2s(L, L->top, func);
    api_incr_top(L);
  }
  swapextra(L);  /* correct before option 'L', which can raise a mem. error */
  if (strchr(what, 'L'))
    collectvalidlines(L, cl);
  lua_unlock(L);
  return status;
}